

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  stbi_uc sVar1;
  int iVar2;
  uint uVar3;
  stbi_uc *psVar4;
  byte *pbVar5;
  char *pcVar6;
  byte bVar7;
  long in_FS_OFFSET;
  bool bVar8;
  
  psVar4 = s->img_buffer;
  if (psVar4 < s->img_buffer_end) {
LAB_0013f002:
    s->img_buffer = psVar4 + 1;
    if (*psVar4 == 'G') {
      psVar4 = s->img_buffer;
      if (s->img_buffer_end <= psVar4) {
        if (s->read_from_callbacks == 0) goto LAB_0013f251;
        stbi__refill_buffer(s);
        psVar4 = s->img_buffer;
      }
      s->img_buffer = psVar4 + 1;
      if (*psVar4 == 'I') {
        psVar4 = s->img_buffer;
        if (s->img_buffer_end <= psVar4) {
          if (s->read_from_callbacks == 0) goto LAB_0013f251;
          stbi__refill_buffer(s);
          psVar4 = s->img_buffer;
        }
        s->img_buffer = psVar4 + 1;
        if (*psVar4 == 'F') {
          psVar4 = s->img_buffer;
          if (s->img_buffer_end <= psVar4) {
            if (s->read_from_callbacks == 0) goto LAB_0013f251;
            stbi__refill_buffer(s);
            psVar4 = s->img_buffer;
          }
          s->img_buffer = psVar4 + 1;
          if (*psVar4 == '8') {
            psVar4 = s->img_buffer;
            if (psVar4 < s->img_buffer_end) {
LAB_0013f0fa:
              s->img_buffer = psVar4 + 1;
              sVar1 = *psVar4;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                psVar4 = s->img_buffer;
                goto LAB_0013f0fa;
              }
              sVar1 = '\0';
            }
            if ((sVar1 == '7') || (sVar1 == '9')) {
              psVar4 = s->img_buffer;
              if (psVar4 < s->img_buffer_end) {
LAB_0013f141:
                s->img_buffer = psVar4 + 1;
                bVar8 = *psVar4 == 'a';
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar4 = s->img_buffer;
                  goto LAB_0013f141;
                }
                bVar8 = false;
              }
              if (bVar8) {
                *(char **)(in_FS_OFFSET + -0x10) = "";
                iVar2 = stbi__get16le(s);
                g->w = iVar2;
                iVar2 = stbi__get16le(s);
                g->h = iVar2;
                pbVar5 = s->img_buffer;
                if (pbVar5 < s->img_buffer_end) {
LAB_0013f1a9:
                  s->img_buffer = pbVar5 + 1;
                  uVar3 = (uint)*pbVar5;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar5 = s->img_buffer;
                    goto LAB_0013f1a9;
                  }
                  uVar3 = 0;
                }
                g->flags = uVar3;
                pbVar5 = s->img_buffer;
                if (pbVar5 < s->img_buffer_end) {
LAB_0013f1e4:
                  s->img_buffer = pbVar5 + 1;
                  uVar3 = (uint)*pbVar5;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar5 = s->img_buffer;
                    goto LAB_0013f1e4;
                  }
                  uVar3 = 0;
                }
                g->bgindex = uVar3;
                pbVar5 = s->img_buffer;
                if (pbVar5 < s->img_buffer_end) {
LAB_0013f21f:
                  s->img_buffer = pbVar5 + 1;
                  uVar3 = (uint)*pbVar5;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar5 = s->img_buffer;
                    goto LAB_0013f21f;
                  }
                  uVar3 = 0;
                }
                g->ratio = uVar3;
                g->transparent = -1;
                if ((g->w < 0x1000001) && (g->h < 0x1000001)) {
                  if (comp != (int *)0x0) {
                    *comp = 4;
                  }
                  if (is_info != 0) {
                    return 1;
                  }
                  bVar7 = (byte)g->flags;
                  if (-1 < (char)bVar7) {
                    return 1;
                  }
                  stbi__gif_parse_colortable(s,g->pal,2 << (bVar7 & 7),-1);
                  return 1;
                }
                pcVar6 = "too large";
                goto LAB_0013f258;
              }
            }
          }
        }
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    psVar4 = s->img_buffer;
    goto LAB_0013f002;
  }
LAB_0013f251:
  pcVar6 = "not GIF";
LAB_0013f258:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar6;
  return 0;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (g->w > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (g->h > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}